

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O0

int etdc_encode(etdc_table **table,uint *input,int size,uchar *output)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _hf_hashv;
  uint _hf_bkt;
  uchar *f;
  uchar *t;
  int k;
  etdc_table *e;
  int ts;
  int i;
  uchar *output_local;
  int size_local;
  uint *input_local;
  etdc_table **table_local;
  
  i = 0;
  t = output;
  do {
    if (size <= i) {
      return (int)t - (int)output;
    }
    e = (etdc_table *)0x0;
    if (*table != (etdc_table *)0x0) {
      _hj_key = (char *)(input + i);
      _hf_hashv = 0xfeedbeef;
      _hj_j = 0x9e3779b9;
      _hj_i = 0x9e3779b9;
      for (_hj_k = 4; 0xb < _hj_k; _hj_k = _hj_k - 0xc) {
        iVar1 = (int)_hj_key[4] + _hj_key[5] * 0x100 + _hj_key[6] * 0x10000 + _hj_key[7] * 0x1000000
                + _hj_j;
        uVar2 = (int)_hj_key[8] + _hj_key[9] * 0x100 + _hj_key[10] * 0x10000 +
                _hj_key[0xb] * 0x1000000 + _hf_hashv;
        uVar3 = uVar2 >> 0xd ^
                (((int)*_hj_key + _hj_key[1] * 0x100 + _hj_key[2] * 0x10000 + _hj_key[3] * 0x1000000
                 + _hj_i) - iVar1) - uVar2;
        uVar4 = uVar3 << 8 ^ (iVar1 - uVar2) - uVar3;
        uVar2 = uVar4 >> 0xd ^ (uVar2 - uVar3) - uVar4;
        uVar3 = uVar2 >> 0xc ^ (uVar3 - uVar4) - uVar2;
        uVar4 = uVar3 << 0x10 ^ (uVar4 - uVar2) - uVar3;
        uVar2 = uVar4 >> 5 ^ (uVar2 - uVar3) - uVar4;
        _hj_i = uVar2 >> 3 ^ (uVar3 - uVar4) - uVar2;
        _hj_j = _hj_i << 10 ^ (uVar4 - uVar2) - _hj_i;
        _hf_hashv = _hj_j >> 0xf ^ (uVar2 - _hj_i) - _hj_j;
        _hj_key = _hj_key + 0xc;
      }
      uVar2 = _hf_hashv + 4;
      switch(_hj_k) {
      case 8:
        _hj_j = (int)_hj_key[4] +
                _hj_key[5] * 0x100 + _hj_key[6] * 0x10000 + _hj_key[7] * 0x1000000 + _hj_j;
      case 4:
        _hj_i = (int)*_hj_key +
                _hj_key[1] * 0x100 + _hj_key[2] * 0x10000 + _hj_key[3] * 0x1000000 + _hj_i;
      default:
        uVar3 = uVar2 >> 0xd ^ (_hj_i - _hj_j) - uVar2;
        uVar4 = uVar3 << 8 ^ (_hj_j - uVar2) - uVar3;
        uVar2 = uVar4 >> 0xd ^ (uVar2 - uVar3) - uVar4;
        uVar3 = uVar2 >> 0xc ^ (uVar3 - uVar4) - uVar2;
        uVar4 = uVar3 << 0x10 ^ (uVar4 - uVar2) - uVar3;
        uVar2 = uVar4 >> 5 ^ (uVar2 - uVar3) - uVar4;
        uVar3 = uVar2 >> 3 ^ (uVar3 - uVar4) - uVar2;
        uVar4 = uVar3 << 10 ^ (uVar4 - uVar2) - uVar3;
        uVar2 = (uVar4 >> 0xf ^ (uVar2 - uVar3) - uVar4) & (((*table)->hh).tbl)->num_buckets - 1;
        if ((((*table)->hh).tbl)->buckets[uVar2].hh_head == (UT_hash_handle *)0x0) {
          e = (etdc_table *)0x0;
        }
        else {
          e = (etdc_table *)
              ((long)(((*table)->hh).tbl)->buckets[uVar2].hh_head - (((*table)->hh).tbl)->hho);
        }
        while ((e != (etdc_table *)0x0 && (((e->hh).keylen != 4 || (*(e->hh).key != input[i]))))) {
          if ((e->hh).hh_next == (UT_hash_handle *)0x0) {
            e = (etdc_table *)0x0;
          }
          else {
            e = (etdc_table *)((long)(e->hh).hh_next - (((*table)->hh).tbl)->hho);
          }
        }
      }
    }
    iVar1 = e->size;
    f = e->code;
    for (k = 0; k < iVar1; k = k + 1) {
      *t = *f;
      f = f + 1;
      t = t + 1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

int etdc_encode(struct etdc_table **table, unsigned int *input, int size, unsigned char *output) {
  int i,ts;
  struct etdc_table *e;
  int k;

  unsigned char *t;
  unsigned char *f;

  t = output;

  for (i = 0; i < size; i++) {
    HASH_FIND_INT( *table, &input[i], e);
    //printf("encoding i: %d -> %u -> ", i ,input[i]);
    ts = e->size;

    f = (unsigned char *) &e->code;

    for(k=0; k < ts; k++) {
      //printf("%u ", *f);
      *(t++) = *(f++);
    }
    //printf("\n");
    /*
    int t;
    printf("%u ->", input[i]);
    for(t=0; t<ts; t++) printf(" %u", output[j+t]);
    printf("\n");
    */

  }
  return (t - output);
}